

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte.h
# Opt level: O2

void __thiscall merlin::detail::node::clear(node *this)

{
  pointer ppnVar1;
  factor *rhs;
  factor local_70;
  
  variable_set::clear(&this->clique);
  factor::factor(&local_70,1.0);
  rhs = factor::operator=(&this->belief,&local_70);
  factor::operator=(&this->theta,rhs);
  factor::~factor(&local_70);
  this->parent = (node *)0x0;
  ppnVar1 = (this->children).
            super__Vector_base<merlin::detail::node_*,_std::allocator<merlin::detail::node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->children).
      super__Vector_base<merlin::detail::node_*,_std::allocator<merlin::detail::node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppnVar1) {
    (this->children).
    super__Vector_base<merlin::detail::node_*,_std::allocator<merlin::detail::node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppnVar1;
  }
  this->weight = 0.0;
  return;
}

Assistant:

void clear() {
			clique.clear();
			theta = belief = factor(1.0);
			parent = NULL; children.clear();
			weight = 0.0;
		}